

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# approximate_quantile.cpp
# Opt level: O0

void duckdb::ApproxQuantileOperation::
     Combine<duckdb::ApproxQuantileState,duckdb::ApproxQuantileListOperation<duckdb::dtime_tz_t>>
               (ApproxQuantileState *source,ApproxQuantileState *target,AggregateInputData *param_3)

{
  TDigest *this;
  long *in_RSI;
  long in_RDI;
  TDigest *in_stack_00000038;
  TDigest *in_stack_00000040;
  Value in_stack_ffffffffffffffc8;
  
  if (*(long *)(in_RDI + 8) != 0) {
    if (*in_RSI == 0) {
      this = (TDigest *)operator_new(0x80);
      duckdb_tdigest::TDigest::TDigest(this,in_stack_ffffffffffffffc8);
      *in_RSI = (long)this;
    }
    duckdb_tdigest::TDigest::merge(in_stack_00000040,in_stack_00000038);
    in_RSI[1] = *(long *)(in_RDI + 8) + in_RSI[1];
  }
  return;
}

Assistant:

static void Combine(const STATE &source, STATE &target, AggregateInputData &) {
		if (source.pos == 0) {
			return;
		}
		D_ASSERT(source.h);
		if (!target.h) {
			target.h = new duckdb_tdigest::TDigest(100);
		}
		target.h->merge(source.h);
		target.pos += source.pos;
	}